

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::PrintValue<std::array<unsigned_char,8ul>,void>
               (array<unsigned_char,_8UL> *container,ostream *os)

{
  long lVar1;
  char local_2d [5];
  
  local_2d[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_2d + 2,1);
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      local_2d[0] = ',';
      std::__ostream_insert<char,std::char_traits<char>>(os,local_2d,1);
    }
    local_2d[1] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_2d + 1,1);
    PrintTo(container->_M_elems[lVar1],os);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  local_2d[3] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_2d + 3,1);
  local_2d[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_2d + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }